

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void print_expr_struct_debug(lyxp_expr *exp)

{
  char *pcVar1;
  size_t local_30;
  size_t used;
  size_t size;
  uint32_t j;
  uint32_t i;
  char *buf;
  lyxp_expr *exp_local;
  
  _j = (char *)0x0;
  used = 0;
  local_30 = 0;
  if ((exp != (lyxp_expr *)0x0) && (2 < ly_ll)) {
    buf = (char *)exp;
    ly_log_dbg(2,"expression \"%s\":",exp->expr);
    for (size._4_4_ = 0; size._4_4_ < *(uint *)(buf + 0x20); size._4_4_ = size._4_4_ + 1) {
      pcVar1 = lyxp_token2str(*(lyxp_token *)(*(long *)buf + (ulong)size._4_4_ * 4));
      print_expr_str((char **)&j,&used,&local_30,"\ttoken %s, in expression \"%.*s\"",pcVar1,
                     (ulong)*(uint *)(*(long *)(buf + 0x10) + (ulong)size._4_4_ * 4),
                     *(long *)(buf + 0x28) +
                     (ulong)*(uint *)(*(long *)(buf + 8) + (ulong)size._4_4_ * 4));
      if ((*(long *)(buf + 0x18) != 0) &&
         (*(long *)(*(long *)(buf + 0x18) + (ulong)size._4_4_ * 8) != 0)) {
        print_expr_str((char **)&j,&used,&local_30," (repeat %d",
                       (ulong)**(uint **)(*(long *)(buf + 0x18) + (ulong)size._4_4_ * 8));
        size._0_4_ = 1;
        while (*(int *)(*(long *)(*(long *)(buf + 0x18) + (ulong)size._4_4_ * 8) +
                       (ulong)(uint)size * 4) != 0) {
          print_expr_str((char **)&j,&used,&local_30,", %d",
                         (ulong)*(uint *)(*(long *)(*(long *)(buf + 0x18) + (ulong)size._4_4_ * 8) +
                                         (ulong)(uint)size * 4));
          size._0_4_ = (uint)size + 1;
        }
        print_expr_str((char **)&j,&used,&local_30,")");
      }
      ly_log_dbg(2,_j);
      local_30 = 0;
    }
    free(_j);
  }
  return;
}

Assistant:

static void
print_expr_struct_debug(const struct lyxp_expr *exp)
{
    char *buf = NULL;
    uint32_t i, j;
    size_t size = 0, used = 0;

    if (!exp || (ly_ll < LY_LLDBG)) {
        return;
    }

    LOGDBG(LY_LDGXPATH, "expression \"%s\":", exp->expr);
    for (i = 0; i < exp->used; ++i) {
        print_expr_str(&buf, &size, &used, "\ttoken %s, in expression \"%.*s\"",
                lyxp_token2str(exp->tokens[i]), exp->tok_len[i], &exp->expr[exp->tok_pos[i]]);

        if (exp->repeat && exp->repeat[i]) {
            print_expr_str(&buf, &size, &used, " (repeat %d", exp->repeat[i][0]);
            for (j = 1; exp->repeat[i][j]; ++j) {
                print_expr_str(&buf, &size, &used, ", %d", exp->repeat[i][j]);
            }
            print_expr_str(&buf, &size, &used, ")");
        }
        LOGDBG(LY_LDGXPATH, buf);
        used = 0;
    }

    free(buf);
}